

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O0

void __thiscall
so_5::environment_t::single_timer<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>
          (environment_t *this,type_index subscription_type,
          unique_ptr<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
          *msg,message_mutability_t mutability,mbox_t *mbox,duration pause)

{
  pointer pnVar1;
  type what;
  intrusive_ptr_t<so_5::message_t> local_40;
  mbox_t *local_38;
  mbox_t *mbox_local;
  unique_ptr<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
  *puStack_28;
  message_mutability_t mutability_local;
  unique_ptr<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
  *msg_local;
  environment_t *this_local;
  duration pause_local;
  type_index subscription_type_local;
  
  local_38 = mbox;
  mbox_local._4_4_ = mutability;
  puStack_28 = msg;
  msg_local = (unique_ptr<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
               *)this;
  this_local = (environment_t *)pause.__r;
  pause_local.__r = (rep)subscription_type._M_target;
  pnVar1 = std::
           unique_ptr<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
           ::get(msg);
  ensure_message_with_actual_data<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>
            (pnVar1);
  what = std::
         unique_ptr<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
         ::operator*(msg);
  change_message_mutability(&what->super_message_t,mbox_local._4_4_);
  pnVar1 = std::
           unique_ptr<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
           ::release(msg);
  intrusive_ptr_t<so_5::message_t>::intrusive_ptr_t(&local_40,&pnVar1->super_message_t);
  single_timer(this,(type_index *)&pause_local,&local_40,local_38,(duration)this_local);
  intrusive_ptr_t<so_5::message_t>::~intrusive_ptr_t(&local_40);
  return;
}

Assistant:

void
		single_timer(
			//! Type to be used for searching subscribers.
			std::type_index subscription_type,
			//! Message to be sent after timeout.
			std::unique_ptr< MESSAGE > msg,
			//! Mutability flag for that message.
			message_mutability_t mutability,
			//! Mbox to which message will be delivered.
			const mbox_t & mbox,
			//! Timeout before delivery.
			std::chrono::steady_clock::duration pause )
		{
			ensure_message_with_actual_data( msg.get() );

			change_message_mutability( *msg, mutability );

			single_timer(
				subscription_type,
				message_ref_t( msg.release() ),
				mbox,
				pause );
		}